

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rewrite.h
# Opt level: O1

Pattern * __thiscall
trieste::detail::Pattern::operator~(Pattern *__return_storage_ptr__,Pattern *this)

{
  undefined1 local_a1;
  Opt *local_a0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_98;
  PatternPtr local_90;
  FastPattern local_80;
  
  local_a0 = (Opt *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<trieste::detail::Opt,std::allocator<trieste::detail::Opt>,std::shared_ptr<trieste::detail::PatternDef>const&>
            (&_Stack_98,&local_a0,(allocator<trieste::detail::Opt> *)&local_a1,
             (shared_ptr<trieste::detail::PatternDef> *)this);
  local_90.super___shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &local_a0->super_PatternDef;
  local_90.super___shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Stack_98._M_pi;
  local_a0 = (Opt *)0x0;
  _Stack_98._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  FastPattern::match_opt(&local_80,&this->fast_pattern);
  Pattern(__return_storage_ptr__,&local_90,&local_80);
  CLI::std::
  _Rb_tree<trieste::Token,_trieste::Token,_std::_Identity<trieste::Token>,_std::less<trieste::Token>,_std::allocator<trieste::Token>_>
  ::~_Rb_tree(&local_80.parents._M_t);
  CLI::std::
  _Rb_tree<trieste::Token,_trieste::Token,_std::_Identity<trieste::Token>,_std::less<trieste::Token>,_std::allocator<trieste::Token>_>
  ::~_Rb_tree((_Rb_tree<trieste::Token,_trieste::Token,_std::_Identity<trieste::Token>,_std::less<trieste::Token>,_std::allocator<trieste::Token>_>
               *)&local_80);
  if (local_90.super___shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_90.super___shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (_Stack_98._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Stack_98._M_pi);
  }
  return __return_storage_ptr__;
}

Assistant:

Pattern operator~() const
      {
        return {
          std::make_shared<Opt>(pattern), FastPattern::match_opt(fast_pattern)};
      }